

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

string * __thiscall
embree::FastAllocator::Statistics::str_abi_cxx11_
          (string *__return_storage_ptr__,Statistics *this,size_t numPrimitives)

{
  ostream *poVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  stringstream str;
  long local_1a8 [2];
  long local_198;
  uint local_190 [2];
  undefined8 auStack_188 [12];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  *(uint *)((long)local_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)local_190 + *(long *)(local_1a8[0] + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"used = ",7);
  *(undefined8 *)((long)auStack_188 + *(long *)(local_198 + -0x18)) = 7;
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 3;
  poVar1 = std::ostream::_M_insert<double>((double)((float)this->bytesUsed * 1e-06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MB, ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"free = ",7);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  poVar1 = std::ostream::_M_insert<double>((double)((float)this->bytesFree * 1e-06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MB, ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"wasted = ",9);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  poVar1 = std::ostream::_M_insert<double>((double)((float)this->bytesWasted * 1e-06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MB, ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"total = ",8);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  poVar1 = std::ostream::_M_insert<double>
                     ((double)((float)(this->bytesFree + this->bytesUsed + this->bytesWasted) *
                              1e-06));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MB, ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"#bytes/prim = ",0xe);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  lVar2 = this->bytesFree + this->bytesUsed + this->bytesWasted;
  auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar3._0_8_ = lVar2;
  auVar3._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)(numPrimitives >> 0x20);
  auVar4._0_8_ = numPrimitives;
  auVar4._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
             ((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)numPrimitives) - 4503599627370496.0)));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string str(size_t numPrimitives)
      {
        std::stringstream str;
        str.setf(std::ios::fixed, std::ios::floatfield);
        str << "used = " << std::setw(7) << std::setprecision(3) << 1E-6f*bytesUsed << " MB, "
            << "free = " << std::setw(7) << std::setprecision(3) << 1E-6f*bytesFree << " MB, "
            << "wasted = " << std::setw(7) << std::setprecision(3) << 1E-6f*bytesWasted << " MB, "            
            << "total = " << std::setw(7) << std::setprecision(3) << 1E-6f*bytesAllocatedTotal() << " MB, "
            << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(bytesAllocatedTotal())/double(numPrimitives);
        return str.str();
      }